

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O0

unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
duckdb::ArrowType::GetArrowLogicalType(DBConfig *config,ArrowSchema *schema)

{
  pointer dictionary_00;
  DBConfig *in_RDX;
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> in_RDI;
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> dictionary;
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *arrow_type;
  ArrowSchema *in_stack_000002d0;
  DBConfig *in_stack_000002d8;
  _Head_base<0UL,_duckdb::ArrowType_*,_false> this;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar1;
  
  uVar1 = 0;
  this._M_head_impl =
       (ArrowType *)
       in_RDI._M_t.super___uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
       ._M_t.super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>.
       super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl;
  GetTypeFromSchema(in_stack_000002d8,in_stack_000002d0);
  if ((in_RDX->replacement_scans).
      super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
      super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    GetArrowLogicalType(in_RDX,(ArrowSchema *)CONCAT17(uVar1,in_stack_ffffffffffffffe0));
    dictionary_00 =
         unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::operator->
                   ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *)
                    this._M_head_impl);
    unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::unique_ptr
              ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *)
               this._M_head_impl,
               (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *)
               dictionary_00);
    SetDictionary(this._M_head_impl,
                  (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *)
                  dictionary_00);
    unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::~unique_ptr
              ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *)
               0x1a27305);
    unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::~unique_ptr
              ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *)
               0x1a2730f);
  }
  return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (__uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>.
         super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ArrowType> ArrowType::GetArrowLogicalType(DBConfig &config, ArrowSchema &schema) {
	auto arrow_type = ArrowType::GetTypeFromSchema(config, schema);
	if (schema.dictionary) {
		auto dictionary = GetArrowLogicalType(config, *schema.dictionary);
		arrow_type->SetDictionary(std::move(dictionary));
	}
	return arrow_type;
}